

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O3

void __thiscall
Assimp::DefaultLogger::WriteToStreams(DefaultLogger *this,char *message,ErrorSeverity ErrorSev)

{
  LogStream *pLVar1;
  int iVar2;
  size_t sVar3;
  pointer ppLVar4;
  char *__s;
  pointer ppLVar5;
  char *__s2;
  
  if (message == (char *)0x0) {
    __assert_fail("nullptr != message",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/DefaultLogger.cpp"
                  ,0x173,"void Assimp::DefaultLogger::WriteToStreams(const char *, ErrorSeverity)");
  }
  __s2 = this->lastMsg;
  iVar2 = strncmp(message,__s2,this->lastLen - 1);
  if (iVar2 == 0) {
    if (this->noRepeatMsg != false) {
      return;
    }
    this->noRepeatMsg = true;
    __s2 = "Skipping one or more lines with the same contents\n";
  }
  else {
    sVar3 = strlen(message);
    this->lastLen = sVar3;
    memcpy(__s2,message,sVar3 + 1);
    __s = __s2 + this->lastLen;
    sVar3 = strlen(__s);
    (__s + sVar3)[0] = '\n';
    (__s + sVar3)[1] = '\0';
    this->noRepeatMsg = false;
    this->lastLen = this->lastLen + 1;
  }
  ppLVar4 = (this->m_StreamArray).
            super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppLVar5 = (this->m_StreamArray).
                 super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppLVar5 != ppLVar4;
      ppLVar5 = ppLVar5 + 1) {
    if (((*ppLVar5)->m_uiErrorSeverity & ErrorSev) != 0) {
      pLVar1 = (*ppLVar5)->m_pStream;
      (*pLVar1->_vptr_LogStream[2])(pLVar1,__s2);
      ppLVar4 = (this->m_StreamArray).
                super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  return;
}

Assistant:

void DefaultLogger::WriteToStreams(const char *message, ErrorSeverity ErrorSev ) {
    ai_assert(nullptr != message);

    // Check whether this is a repeated message
    if (! ::strncmp( message,lastMsg, lastLen-1))
    {
        if (!noRepeatMsg)
        {
            noRepeatMsg = true;
            message = "Skipping one or more lines with the same contents\n";
        }
        else return;
    }
    else
    {
        // append a new-line character to the message to be printed
        lastLen = ::strlen(message);
        ::memcpy(lastMsg,message,lastLen+1);
        ::strcat(lastMsg+lastLen,"\n");

        message = lastMsg;
        noRepeatMsg = false;
        ++lastLen;
    }
    for ( ConstStreamIt it = m_StreamArray.begin();
        it != m_StreamArray.end();
        ++it)
    {
        if ( ErrorSev & (*it)->m_uiErrorSeverity )
            (*it)->m_pStream->write( message);
    }
}